

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst.c
# Opt level: O0

void av1_compute_stats_c(int wiener_win,uint8_t *dgd,uint8_t *src,int16_t *dgd_avg,int16_t *src_avg,
                        int h_start,int h_end,int v_start,int v_end,int dgd_stride,int src_stride,
                        int64_t *M,int64_t *H,int use_downsampled_wiener_stats)

{
  long lVar1;
  uint8_t *in_RSI;
  int in_EDI;
  int in_R9D;
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  int in_stack_00000020;
  int downsample_factor;
  int32_t H_row [2401];
  int32_t M_row [49];
  uint8_t avg;
  int wiener_halfwin;
  int wiener_win2;
  int l;
  int k;
  int i;
  int in_stack_ffffffffffffd92c;
  int in_stack_ffffffffffffd934;
  int in_stack_ffffffffffffd950;
  int local_26ac;
  int in_stack_ffffffffffffd958;
  int32_t *in_stack_ffffffffffffd960;
  int32_t *in_stack_ffffffffffffd968;
  int in_stack_ffffffffffffd970;
  int local_118 [49];
  uint8_t local_51;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  
  local_4c = in_EDI * in_EDI;
  local_50 = in_EDI >> 1;
  local_51 = find_average(in_RSI,in_R9D,in_stack_00000008,in_stack_00000010,in_stack_00000018,
                          in_stack_00000020);
  memset(local_118,0,0xc4);
  memset(&stack0xffffffffffffd958,0,0x2584);
  local_26ac = 1;
  if (H_row[4] != 0) {
    local_26ac = 4;
  }
  memset((void *)H_row._0_8_,0,(long)local_4c << 3);
  memset((void *)H_row._8_8_,0,(long)local_4c * 8 * (long)local_4c);
  for (local_40 = in_stack_00000010; local_40 < in_stack_00000018; local_40 = local_40 + local_26ac)
  {
    if ((H_row[4] != 0) && (in_stack_00000018 - local_40 < 4)) {
      local_26ac = in_stack_00000018 - local_40;
    }
    memset(local_118,0,0xc4);
    memset(&stack0xffffffffffffd958,0,0x2584);
    acc_stat_one_line(&stack0xffffffffffffd958,(uint8_t *)local_118,in_stack_ffffffffffffd934,
                      local_4c,in_stack_ffffffffffffd92c,(uint8_t)((uint)local_50 >> 0x18),
                      in_stack_ffffffffffffd950,in_stack_ffffffffffffd958,in_stack_ffffffffffffd960,
                      in_stack_ffffffffffffd968,in_stack_ffffffffffffd970);
    for (local_44 = 0; local_44 < local_4c; local_44 = local_44 + 1) {
      *(long *)(H_row._0_8_ + (long)local_44 * 8) =
           (long)local_118[local_44] * (long)local_26ac +
           *(long *)(H_row._0_8_ + (long)local_44 * 8);
      for (local_48 = local_44; local_48 < local_4c; local_48 = local_48 + 1) {
        lVar1 = (long)(local_44 * local_4c + local_48);
        *(long *)(H_row._8_8_ + lVar1 * 8) =
             (long)*(int *)(&stack0xffffffffffffd958 + (long)(local_44 * local_4c + local_48) * 4) *
             (long)local_26ac + *(long *)(H_row._8_8_ + lVar1 * 8);
      }
    }
  }
  for (local_44 = 0; local_48 = local_44, local_44 < local_4c; local_44 = local_44 + 1) {
    while (local_48 = local_48 + 1, local_48 < local_4c) {
      *(undefined8 *)(H_row._8_8_ + (long)(local_48 * local_4c + local_44) * 8) =
           *(undefined8 *)(H_row._8_8_ + (long)(local_44 * local_4c + local_48) * 8);
    }
  }
  return;
}

Assistant:

void av1_compute_stats_c(int wiener_win, const uint8_t *dgd, const uint8_t *src,
                         int16_t *dgd_avg, int16_t *src_avg, int h_start,
                         int h_end, int v_start, int v_end, int dgd_stride,
                         int src_stride, int64_t *M, int64_t *H,
                         int use_downsampled_wiener_stats) {
  (void)dgd_avg;
  (void)src_avg;
  int i, k, l;
  const int wiener_win2 = wiener_win * wiener_win;
  const int wiener_halfwin = (wiener_win >> 1);
  uint8_t avg = find_average(dgd, h_start, h_end, v_start, v_end, dgd_stride);
  int32_t M_row[WIENER_WIN2] = { 0 };
  int32_t H_row[WIENER_WIN2 * WIENER_WIN2] = { 0 };
  int downsample_factor =
      use_downsampled_wiener_stats ? WIENER_STATS_DOWNSAMPLE_FACTOR : 1;

  memset(M, 0, sizeof(*M) * wiener_win2);
  memset(H, 0, sizeof(*H) * wiener_win2 * wiener_win2);

  for (i = v_start; i < v_end; i = i + downsample_factor) {
    if (use_downsampled_wiener_stats &&
        (v_end - i < WIENER_STATS_DOWNSAMPLE_FACTOR)) {
      downsample_factor = v_end - i;
    }

    memset(M_row, 0, sizeof(int32_t) * WIENER_WIN2);
    memset(H_row, 0, sizeof(int32_t) * WIENER_WIN2 * WIENER_WIN2);
    acc_stat_one_line(dgd, src + i * src_stride, dgd_stride, h_start, h_end,
                      avg, wiener_halfwin, wiener_win2, M_row, H_row, i);

    for (k = 0; k < wiener_win2; ++k) {
      // Scale M matrix based on the downsampling factor
      M[k] += ((int64_t)M_row[k] * downsample_factor);
      for (l = k; l < wiener_win2; ++l) {
        // H is a symmetric matrix, so we only need to fill out the upper
        // triangle here. We can copy it down to the lower triangle outside
        // the (i, j) loops.
        // Scale H Matrix based on the downsampling factor
        H[k * wiener_win2 + l] +=
            ((int64_t)H_row[k * wiener_win2 + l] * downsample_factor);
      }
    }
  }

  for (k = 0; k < wiener_win2; ++k) {
    for (l = k + 1; l < wiener_win2; ++l) {
      H[l * wiener_win2 + k] = H[k * wiener_win2 + l];
    }
  }
}